

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O2

void __thiscall
HeadersGeneratorSetup::GenerateHeaders
          (HeadersGeneratorSetup *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
          size_t count,uint256 *starting_hash,int nVersion,int prev_time,uint256 *merkle_root,
          uint32_t nBits)

{
  pointer pCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  HeadersGeneratorSetup *this_00;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super_base_blob<256U>.m_data._M_elems._0_4_ =
       *(undefined4 *)(starting_hash->super_base_blob<256U>).m_data._M_elems;
  local_58.super_base_blob<256U>.m_data._M_elems._4_4_ =
       *(undefined4 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 4);
  local_58.super_base_blob<256U>.m_data._M_elems._8_4_ =
       *(undefined4 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 8);
  local_58.super_base_blob<256U>.m_data._M_elems._12_4_ =
       *(undefined4 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 0xc);
  local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  while( true ) {
    if (count <= (ulong)(((long)(headers->
                                super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(headers->
                               super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                               _M_impl.super__Vector_impl_data._M_start) / 0x50)) break;
    this_00 = (HeadersGeneratorSetup *)headers;
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::emplace_back<>(headers);
    pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar1[-1].nVersion = nVersion;
    *(undefined8 *)(pCVar1[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(pCVar1[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(ulong *)pCVar1[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems =
         CONCAT44(local_58.super_base_blob<256U>.m_data._M_elems._4_4_,
                  local_58.super_base_blob<256U>.m_data._M_elems._0_4_);
    *(ulong *)(pCVar1[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) =
         CONCAT44(local_58.super_base_blob<256U>.m_data._M_elems._12_4_,
                  local_58.super_base_blob<256U>.m_data._M_elems._8_4_);
    uVar2 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 8);
    uVar3 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 0x10);
    uVar4 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)pCVar1[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
         *(undefined8 *)(merkle_root->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)(pCVar1[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) = uVar2;
    *(undefined8 *)(pCVar1[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) = uVar3;
    *(undefined8 *)(pCVar1[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
    pCVar1[-1].nTime = prev_time + 1;
    pCVar1[-1].nBits = nBits;
    FindProofOfWork(this_00,pCVar1 + -1);
    CBlockHeader::GetHash(&local_58,pCVar1 + -1);
    prev_time = pCVar1[-1].nTime;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersGeneratorSetup::GenerateHeaders(std::vector<CBlockHeader>& headers,
        size_t count, const uint256& starting_hash, const int nVersion, int prev_time,
        const uint256& merkle_root, const uint32_t nBits)
{
    uint256 prev_hash = starting_hash;

    while (headers.size() < count) {
        headers.emplace_back();
        CBlockHeader& next_header = headers.back();;
        next_header.nVersion = nVersion;
        next_header.hashPrevBlock = prev_hash;
        next_header.hashMerkleRoot = merkle_root;
        next_header.nTime = prev_time+1;
        next_header.nBits = nBits;

        FindProofOfWork(next_header);
        prev_hash = next_header.GetHash();
        prev_time = next_header.nTime;
    }
    return;
}